

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex2-server.c
# Opt level: O0

void ssh2kex_coroutine(ssh2_transport_state *s,_Bool *aborted)

{
  int iVar1;
  LogContext *pLVar2;
  uint *puVar3;
  Ssh *pSVar4;
  _Bool _Var5;
  uint uVar6;
  int *piVar7;
  ssh_keyalg *psVar8;
  unsigned_long uVar9;
  ProgressReceiverVtable *ctx;
  PrimeCandidateSource *pcs;
  dh_ctx *pdVar10;
  ssh_hashalg *psVar11;
  char *event;
  ecdh_key *peVar12;
  RSAKey *pRVar13;
  PktIn *pPVar14;
  char *pcVar15;
  mp_int *pmVar16;
  PktOut *pPVar17;
  strbuf *psVar18;
  ptrlen pVar19;
  ptrlen encrypted_secret;
  mp_int *K_1;
  strbuf *pubblob;
  ProgressReceiver null_progress_1;
  PrimeGenerationContext *pgc_1;
  int klen;
  ssh_rsa_kex_extra *extra;
  strbuf *pubpoint;
  _Bool ok;
  ptrlen keydata;
  char *desc;
  mp_int *K;
  char *err;
  ProgressReceiver null_progress;
  PrimeGenerationContext *pgc;
  size_t local_48;
  int local_3c;
  int i;
  int *crLine;
  PktOut *pktout;
  PktIn *pktin;
  PacketProtocolLayer *ppl;
  _Bool *aborted_local;
  ssh2_transport_state *s_local;
  
  piVar7 = &s->crStateKex;
  iVar1 = s->crStateKex;
  if (iVar1 == 0) {
    for (local_3c = 0; local_3c < s->nhostkeys; local_3c = local_3c + 1) {
      psVar8 = ssh_key_alg(s->hostkeys[local_3c]);
      if (psVar8 == s->hostkey_alg) {
        s->hkey = s->hostkeys[local_3c];
        break;
      }
    }
    if (s->hkey == (ssh_key *)0x0) {
      __assert_fail("s->hkey",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/kex2-server.c"
                    ,0x36,"void ssh2kex_coroutine(struct ssh2_transport_state *, _Bool *)");
    }
    strbuf_clear(s->hostkeyblob);
    ssh_key_public_blob(s->hkey,s->hostkeyblob->binarysink_);
    pVar19 = ptrlen_from_strbuf(s->hostkeyblob);
    pgc = (PrimeGenerationContext *)pVar19.ptr;
    (s->hostkeydata).ptr = pgc;
    local_48 = pVar19.len;
    (s->hostkeydata).len = local_48;
    BinarySink_put_stringpl(s->exhash->binarysink_,s->hostkeydata);
    if (s->kex_alg->main_type != KEXTYPE_DH) {
      if (s->kex_alg->main_type == KEXTYPE_ECDH) {
        pcVar15 = ecdh_keyalg_description(s->kex_alg);
        pLVar2 = (s->ppl).logctx;
        psVar11 = ssh_hash_alg(s->exhash);
        event = dupprintf("Doing %s, using hash %s",pcVar15,psVar11->text_name);
        logevent_and_free(pLVar2,event);
        safefree(pcVar15);
        peVar12 = ecdh_key_new(s->kex_alg,true);
        s->ecdh_key = peVar12;
        if (s->ecdh_key == (ecdh_key *)0x0) {
          ssh_sw_abort((s->ppl).ssh,"Unable to generate key for ECDH");
          *aborted = true;
          return;
        }
        *piVar7 = 0xce;
LAB_00144252:
        pPVar14 = ssh2_transport_pop(s);
        if (pPVar14 == (PktIn *)0x0) {
          return;
        }
        if (pPVar14->type != 0x1e) {
          pSVar4 = (s->ppl).ssh;
          uVar6 = pPVar14->type;
          pcVar15 = ssh2_pkt_type(((s->ppl).bpp)->pls->kctx,((s->ppl).bpp)->pls->actx,pPVar14->type)
          ;
          ssh_proto_error(pSVar4,
                          "Received unexpected packet when expecting ECDH initial packet, type %d (%s)"
                          ,(ulong)uVar6,pcVar15);
          *aborted = true;
          return;
        }
        pVar19 = BinarySource_get_string(pPVar14->binarysource_);
        BinarySink_put_stringpl(s->exhash->binarysink_,pVar19);
        _Var5 = ecdh_key_getkey(s->ecdh_key,pVar19,s->kex_shared_secret->binarysink_);
        if ((pPVar14->binarysource_[0].err == BSE_NO_ERROR) && (!_Var5)) {
          ssh_proto_error((s->ppl).ssh,
                          "Received invalid elliptic curve point in ECDH initial packet");
          *aborted = true;
          return;
        }
        pPVar17 = ssh_bpp_new_pktout((s->ppl).bpp,0x1f);
        BinarySink_put_stringpl(pPVar17->binarysink_,s->hostkeydata);
        psVar18 = strbuf_new();
        ecdh_key_getpublic(s->ecdh_key,psVar18->binarysink_);
        BinarySink_put_string(s->exhash->binarysink_,psVar18->u,psVar18->len);
        BinarySink_put_stringsb(pPVar17->binarysink_,psVar18);
        psVar18 = finalise_and_sign_exhash(s);
        BinarySink_put_stringsb(pPVar17->binarysink_,psVar18);
        pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar17->qnode);
        ecdh_key_free(s->ecdh_key);
        s->ecdh_key = (ecdh_key *)0x0;
        goto LAB_001449e3;
      }
      if (s->kex_alg->main_type == KEXTYPE_GSS) {
        ssh_sw_abort((s->ppl).ssh,"GSS key exchange not supported in server");
        goto LAB_001449e3;
      }
      if (s->kex_alg->main_type != KEXTYPE_RSA) {
        __assert_fail("s->kex_alg->main_type == KEXTYPE_RSA",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/kex2-server.c"
                      ,0xf8,"void ssh2kex_coroutine(struct ssh2_transport_state *, _Bool *)");
      }
      pLVar2 = (s->ppl).logctx;
      psVar11 = ssh_hash_alg(s->exhash);
      pcVar15 = dupprintf("Doing RSA key exchange with hash %s",psVar11->text_name);
      logevent_and_free(pLVar2,pcVar15);
      ((s->ppl).bpp)->pls->kctx = SSH2_PKTCTX_RSAKEX;
      puVar3 = (uint *)s->kex_alg->extra;
      if ((s->ssc != (SshServerConfig *)0x0) && (s->ssc->rsa_kex_key != (RSAKey *)0x0)) {
        uVar6 = ssh_rsakex_klen(s->ssc->rsa_kex_key);
        if ((int)uVar6 < (int)*puVar3) {
          pLVar2 = (s->ppl).logctx;
          pcVar15 = dupprintf("Configured %d-bit RSA key is too short (min %d)",(ulong)uVar6,
                              (ulong)*puVar3);
          logevent_and_free(pLVar2,pcVar15);
        }
        else {
          pLVar2 = (s->ppl).logctx;
          pcVar15 = dupprintf("Using configured %d-bit RSA key",(ulong)uVar6);
          logevent_and_free(pLVar2,pcVar15);
          s->rsa_kex_key = s->ssc->rsa_kex_key;
        }
      }
      if (s->rsa_kex_key == (RSAKey *)0x0) {
        pLVar2 = (s->ppl).logctx;
        pcVar15 = dupprintf("Generating a %d-bit RSA key",(ulong)*puVar3);
        logevent_and_free(pLVar2,pcVar15);
        pRVar13 = (RSAKey *)safemalloc(1,0x48,0);
        s->rsa_kex_key = pRVar13;
        null_progress_1.vt = (ProgressReceiverVtable *)primegen_new_context(&primegen_probabilistic)
        ;
        pubblob = (strbuf *)&null_progress_vt;
        rsa_generate(s->rsa_kex_key,*puVar3,false,(PrimeGenerationContext *)null_progress_1.vt,
                     (ProgressReceiver *)&pubblob);
        primegen_free_context((PrimeGenerationContext *)null_progress_1.vt);
        s->rsa_kex_key->comment = (char *)0x0;
        s->rsa_kex_key_needs_freeing = true;
      }
      pPVar17 = ssh_bpp_new_pktout((s->ppl).bpp,0x1e);
      BinarySink_put_stringpl(pPVar17->binarysink_,s->hostkeydata);
      psVar18 = strbuf_new();
      ssh_key_public_blob(&s->rsa_kex_key->sshk,psVar18->binarysink_);
      BinarySink_put_string(s->exhash->binarysink_,psVar18->u,psVar18->len);
      BinarySink_put_stringsb(pPVar17->binarysink_,psVar18);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar17->qnode);
      *piVar7 = 0x127;
LAB_001447d7:
      pPVar14 = ssh2_transport_pop(s);
      if (pPVar14 == (PktIn *)0x0) {
        return;
      }
      if (pPVar14->type != 0x1f) {
        pSVar4 = (s->ppl).ssh;
        uVar6 = pPVar14->type;
        pcVar15 = ssh2_pkt_type(((s->ppl).bpp)->pls->kctx,((s->ppl).bpp)->pls->actx,pPVar14->type);
        ssh_proto_error(pSVar4,
                        "Received unexpected packet when expecting RSA kex secret, type %d (%s)",
                        (ulong)uVar6,pcVar15);
        *aborted = true;
        return;
      }
      pVar19 = BinarySource_get_string(pPVar14->binarysource_);
      BinarySink_put_stringpl(s->exhash->binarysink_,pVar19);
      pmVar16 = ssh_rsakex_decrypt(s->rsa_kex_key,s->kex_alg->hash,pVar19);
      if (pmVar16 == (mp_int *)0x0) {
        ssh_proto_error((s->ppl).ssh,"Unable to decrypt RSA kex secret");
        *aborted = true;
        return;
      }
      BinarySink_put_mp_ssh2(s->kex_shared_secret->binarysink_,pmVar16);
      mp_free(pmVar16);
      if ((s->rsa_kex_key_needs_freeing & 1U) != 0) {
        ssh_rsakex_freekey(s->rsa_kex_key);
        safefree(s->rsa_kex_key);
      }
      s->rsa_kex_key = (RSAKey *)0x0;
      s->rsa_kex_key_needs_freeing = false;
      pPVar17 = ssh_bpp_new_pktout((s->ppl).bpp,0x20);
      psVar18 = finalise_and_sign_exhash(s);
      BinarySink_put_stringsb(pPVar17->binarysink_,psVar18);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar17->qnode);
      goto LAB_001449e3;
    }
    _Var5 = dh_is_gex(s->kex_alg);
    if (_Var5) {
      pLVar2 = (s->ppl).logctx;
      pcVar15 = dupprintf("Doing Diffie-Hellman group exchange");
      logevent_and_free(pLVar2,pcVar15);
      ((s->ppl).bpp)->pls->kctx = SSH2_PKTCTX_DHGEX;
      *piVar7 = 0x48;
      goto LAB_00143a69;
    }
    ((s->ppl).bpp)->pls->kctx = SSH2_PKTCTX_DHGROUP;
    pdVar10 = dh_setup_group(s->kex_alg);
    s->dh_ctx = pdVar10;
    s->kex_init_value = 0x1e;
    s->kex_reply_value = 0x1f;
    pLVar2 = (s->ppl).logctx;
    pcVar15 = dupprintf("Using Diffie-Hellman with standard group \"%s\"",s->kex_alg->groupname);
    logevent_and_free(pLVar2,pcVar15);
LAB_00143d4b:
    pLVar2 = (s->ppl).logctx;
    psVar11 = ssh_hash_alg(s->exhash);
    pcVar15 = dupprintf("Doing Diffie-Hellman key exchange with hash %s",psVar11->text_name);
    logevent_and_free(pLVar2,pcVar15);
    pmVar16 = dh_create_e(s->dh_ctx);
    s->e = pmVar16;
    *piVar7 = 0x88;
  }
  else {
    if (iVar1 == 0x48) {
LAB_00143a69:
      pPVar14 = ssh2_transport_pop(s);
      if (pPVar14 == (PktIn *)0x0) {
        return;
      }
      if ((pPVar14->type != 0x22) && (pPVar14->type != 0x1e)) {
        pSVar4 = (s->ppl).ssh;
        uVar6 = pPVar14->type;
        pcVar15 = ssh2_pkt_type(((s->ppl).bpp)->pls->kctx,((s->ppl).bpp)->pls->actx,pPVar14->type);
        ssh_proto_error(pSVar4,
                        "Received unexpected packet when expecting Diffie-Hellman group exchange request, type %d (%s)"
                        ,(ulong)uVar6,pcVar15);
        *aborted = true;
        return;
      }
      if (pPVar14->type == 0x1e) {
        s->dh_got_size_bounds = false;
        uVar9 = BinarySource_get_uint32(pPVar14->binarysource_);
        s->pbits = (int)uVar9;
      }
      else {
        s->dh_got_size_bounds = true;
        uVar9 = BinarySource_get_uint32(pPVar14->binarysource_);
        s->dh_min_size = (int)uVar9;
        uVar9 = BinarySource_get_uint32(pPVar14->binarysource_);
        s->pbits = (int)uVar9;
        uVar9 = BinarySource_get_uint32(pPVar14->binarysource_);
        s->dh_max_size = (int)uVar9;
      }
      ctx = (ProgressReceiverVtable *)primegen_new_context(&primegen_probabilistic);
      err = "`j\x14";
      null_progress.vt = ctx;
      pcs = pcs_new(s->pbits);
      pmVar16 = primegen_generate((PrimeGenerationContext *)ctx,pcs,(ProgressReceiver *)&err);
      s->p = pmVar16;
      primegen_free_context((PrimeGenerationContext *)null_progress.vt);
      pmVar16 = mp_from_integer(2);
      s->g = pmVar16;
      pdVar10 = dh_setup_gex(s->p,s->g);
      s->dh_ctx = pdVar10;
      s->kex_init_value = 0x20;
      s->kex_reply_value = 0x21;
      pPVar17 = ssh_bpp_new_pktout((s->ppl).bpp,0x1f);
      BinarySink_put_mp_ssh2(pPVar17->binarysink_,s->p);
      BinarySink_put_mp_ssh2(pPVar17->binarysink_,s->g);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar17->qnode);
      goto LAB_00143d4b;
    }
    if (iVar1 != 0x88) {
      if (iVar1 == 0xce) goto LAB_00144252;
      if (iVar1 != 0x127) goto LAB_001449e3;
      goto LAB_001447d7;
    }
  }
  pPVar14 = ssh2_transport_pop(s);
  if (pPVar14 == (PktIn *)0x0) {
    return;
  }
  if (pPVar14->type != s->kex_init_value) {
    pSVar4 = (s->ppl).ssh;
    uVar6 = pPVar14->type;
    pcVar15 = ssh2_pkt_type(((s->ppl).bpp)->pls->kctx,((s->ppl).bpp)->pls->actx,pPVar14->type);
    ssh_proto_error(pSVar4,
                    "Received unexpected packet when expecting Diffie-Hellman initial packet, type %d (%s)"
                    ,(ulong)uVar6,pcVar15);
    *aborted = true;
    return;
  }
  pmVar16 = BinarySource_get_mp_ssh2(pPVar14->binarysource_);
  s->f = pmVar16;
  if (pPVar14->binarysource_[0].err != BSE_NO_ERROR) {
    ssh_proto_error((s->ppl).ssh,"Unable to parse Diffie-Hellman initial packet");
    *aborted = true;
    return;
  }
  pcVar15 = dh_validate_f(s->dh_ctx,s->f);
  if (pcVar15 != (char *)0x0) {
    ssh_proto_error((s->ppl).ssh,"Diffie-Hellman initial packet failed validation: %s",pcVar15);
    *aborted = true;
    return;
  }
  pmVar16 = dh_find_K(s->dh_ctx,s->f);
  BinarySink_put_mp_ssh2(s->kex_shared_secret->binarysink_,pmVar16);
  mp_free(pmVar16);
  _Var5 = dh_is_gex(s->kex_alg);
  if (_Var5) {
    if ((s->dh_got_size_bounds & 1U) != 0) {
      BinarySink_put_uint32(s->exhash->binarysink_,(long)s->dh_min_size);
    }
    BinarySink_put_uint32(s->exhash->binarysink_,(long)s->pbits);
    if ((s->dh_got_size_bounds & 1U) != 0) {
      BinarySink_put_uint32(s->exhash->binarysink_,(long)s->dh_max_size);
    }
    BinarySink_put_mp_ssh2(s->exhash->binarysink_,s->p);
    BinarySink_put_mp_ssh2(s->exhash->binarysink_,s->g);
  }
  BinarySink_put_mp_ssh2(s->exhash->binarysink_,s->f);
  BinarySink_put_mp_ssh2(s->exhash->binarysink_,s->e);
  pPVar17 = ssh_bpp_new_pktout((s->ppl).bpp,s->kex_reply_value);
  BinarySink_put_stringpl(pPVar17->binarysink_,s->hostkeydata);
  BinarySink_put_mp_ssh2(pPVar17->binarysink_,s->e);
  psVar18 = finalise_and_sign_exhash(s);
  BinarySink_put_stringsb(pPVar17->binarysink_,psVar18);
  pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar17->qnode);
  dh_cleanup(s->dh_ctx);
  s->dh_ctx = (dh_ctx *)0x0;
  mp_free(s->f);
  s->f = (mp_int *)0x0;
  _Var5 = dh_is_gex(s->kex_alg);
  if (_Var5) {
    mp_free(s->g);
    s->g = (mp_int *)0x0;
    mp_free(s->p);
    s->p = (mp_int *)0x0;
  }
LAB_001449e3:
  *piVar7 = 0;
  return;
}

Assistant:

void ssh2kex_coroutine(struct ssh2_transport_state *s, bool *aborted)
{
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    PktIn *pktin;
    PktOut *pktout;

    crBegin(s->crStateKex);

    {
        int i;
        for (i = 0; i < s->nhostkeys; i++)
            if (ssh_key_alg(s->hostkeys[i]) == s->hostkey_alg) {
                s->hkey = s->hostkeys[i];
                break;
            }
        assert(s->hkey);
    }

    strbuf_clear(s->hostkeyblob);
    ssh_key_public_blob(s->hkey, BinarySink_UPCAST(s->hostkeyblob));
    s->hostkeydata = ptrlen_from_strbuf(s->hostkeyblob);

    put_stringpl(s->exhash, s->hostkeydata);

    if (s->kex_alg->main_type == KEXTYPE_DH) {
        /*
         * If we're doing Diffie-Hellman group exchange, start by
         * waiting for the group request.
         */
        if (dh_is_gex(s->kex_alg)) {
            ppl_logevent("Doing Diffie-Hellman group exchange");
            s->ppl.bpp->pls->kctx = SSH2_PKTCTX_DHGEX;

            crMaybeWaitUntilV((pktin = ssh2_transport_pop(s)) != NULL);
            if (pktin->type != SSH2_MSG_KEX_DH_GEX_REQUEST &&
                pktin->type != SSH2_MSG_KEX_DH_GEX_REQUEST_OLD) {
                ssh_proto_error(s->ppl.ssh, "Received unexpected packet when "
                                "expecting Diffie-Hellman group exchange "
                                "request, type %d (%s)", pktin->type,
                                ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                              s->ppl.bpp->pls->actx,
                                              pktin->type));
                *aborted = true;
                return;
            }

            if (pktin->type != SSH2_MSG_KEX_DH_GEX_REQUEST_OLD) {
                s->dh_got_size_bounds = true;
                s->dh_min_size = get_uint32(pktin);
                s->pbits = get_uint32(pktin);
                s->dh_max_size = get_uint32(pktin);
            } else {
                s->dh_got_size_bounds = false;
                s->pbits = get_uint32(pktin);
            }

            /*
             * This is a hopeless strategy for making a secure DH
             * group! It's good enough for testing a client against,
             * but not for serious use.
             */
            PrimeGenerationContext *pgc = primegen_new_context(
                &primegen_probabilistic);
            ProgressReceiver null_progress;
            null_progress.vt = &null_progress_vt;
            s->p = primegen_generate(pgc, pcs_new(s->pbits), &null_progress);
            primegen_free_context(pgc);

            s->g = mp_from_integer(2);
            s->dh_ctx = dh_setup_gex(s->p, s->g);
            s->kex_init_value = SSH2_MSG_KEX_DH_GEX_INIT;
            s->kex_reply_value = SSH2_MSG_KEX_DH_GEX_REPLY;

            pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_KEX_DH_GEX_GROUP);
            put_mp_ssh2(pktout, s->p);
            put_mp_ssh2(pktout, s->g);
            pq_push(s->ppl.out_pq, pktout);
        } else {
            s->ppl.bpp->pls->kctx = SSH2_PKTCTX_DHGROUP;
            s->dh_ctx = dh_setup_group(s->kex_alg);
            s->kex_init_value = SSH2_MSG_KEXDH_INIT;
            s->kex_reply_value = SSH2_MSG_KEXDH_REPLY;
            ppl_logevent("Using Diffie-Hellman with standard group \"%s\"",
                         s->kex_alg->groupname);
        }

        ppl_logevent("Doing Diffie-Hellman key exchange with hash %s",
                     ssh_hash_alg(s->exhash)->text_name);

        /*
         * Generate e for Diffie-Hellman.
         */
        s->e = dh_create_e(s->dh_ctx);

        /*
         * Wait to receive f.
         */
        crMaybeWaitUntilV((pktin = ssh2_transport_pop(s)) != NULL);
        if (pktin->type != s->kex_init_value) {
            ssh_proto_error(s->ppl.ssh, "Received unexpected packet when "
                            "expecting Diffie-Hellman initial packet, "
                            "type %d (%s)", pktin->type,
                            ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                          s->ppl.bpp->pls->actx,
                                          pktin->type));
            *aborted = true;
            return;
        }
        s->f = get_mp_ssh2(pktin);
        if (get_err(pktin)) {
            ssh_proto_error(s->ppl.ssh,
                            "Unable to parse Diffie-Hellman initial packet");
            *aborted = true;
            return;
        }

        {
            const char *err = dh_validate_f(s->dh_ctx, s->f);
            if (err) {
                ssh_proto_error(s->ppl.ssh, "Diffie-Hellman initial packet "
                                "failed validation: %s", err);
                *aborted = true;
                return;
            }
        }
        mp_int *K = dh_find_K(s->dh_ctx, s->f);
        put_mp_ssh2(s->kex_shared_secret, K);
        mp_free(K);

        if (dh_is_gex(s->kex_alg)) {
            if (s->dh_got_size_bounds)
                put_uint32(s->exhash, s->dh_min_size);
            put_uint32(s->exhash, s->pbits);
            if (s->dh_got_size_bounds)
                put_uint32(s->exhash, s->dh_max_size);
            put_mp_ssh2(s->exhash, s->p);
            put_mp_ssh2(s->exhash, s->g);
        }
        put_mp_ssh2(s->exhash, s->f);
        put_mp_ssh2(s->exhash, s->e);

        pktout = ssh_bpp_new_pktout(s->ppl.bpp, s->kex_reply_value);
        put_stringpl(pktout, s->hostkeydata);
        put_mp_ssh2(pktout, s->e);
        put_stringsb(pktout, finalise_and_sign_exhash(s));
        pq_push(s->ppl.out_pq, pktout);

        dh_cleanup(s->dh_ctx);
        s->dh_ctx = NULL;
        mp_free(s->f); s->f = NULL;
        if (dh_is_gex(s->kex_alg)) {
            mp_free(s->g); s->g = NULL;
            mp_free(s->p); s->p = NULL;
        }
    } else if (s->kex_alg->main_type == KEXTYPE_ECDH) {
        char *desc = ecdh_keyalg_description(s->kex_alg);
        ppl_logevent("Doing %s, using hash %s", desc,
                     ssh_hash_alg(s->exhash)->text_name);
        sfree(desc);

        s->ecdh_key = ecdh_key_new(s->kex_alg, true);
        if (!s->ecdh_key) {
            ssh_sw_abort(s->ppl.ssh, "Unable to generate key for ECDH");
            *aborted = true;
            return;
        }

        crMaybeWaitUntilV((pktin = ssh2_transport_pop(s)) != NULL);
        if (pktin->type != SSH2_MSG_KEX_ECDH_INIT) {
            ssh_proto_error(s->ppl.ssh, "Received unexpected packet when "
                            "expecting ECDH initial packet, type %d (%s)",
                            pktin->type,
                            ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                          s->ppl.bpp->pls->actx,
                                          pktin->type));
            *aborted = true;
            return;
        }

        {
            ptrlen keydata = get_string(pktin);
            put_stringpl(s->exhash, keydata);

            bool ok = ecdh_key_getkey(s->ecdh_key, keydata,
                                      BinarySink_UPCAST(s->kex_shared_secret));
            if (!get_err(pktin) && !ok) {
                ssh_proto_error(s->ppl.ssh, "Received invalid elliptic curve "
                                "point in ECDH initial packet");
                *aborted = true;
                return;
            }
        }

        pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_KEX_ECDH_REPLY);
        put_stringpl(pktout, s->hostkeydata);
        {
            strbuf *pubpoint = strbuf_new();
            ecdh_key_getpublic(s->ecdh_key, BinarySink_UPCAST(pubpoint));
            put_string(s->exhash, pubpoint->u, pubpoint->len);
            put_stringsb(pktout, pubpoint);
        }
        put_stringsb(pktout, finalise_and_sign_exhash(s));
        pq_push(s->ppl.out_pq, pktout);

        ecdh_key_free(s->ecdh_key);
        s->ecdh_key = NULL;
    } else if (s->kex_alg->main_type == KEXTYPE_GSS) {
        ssh_sw_abort(s->ppl.ssh, "GSS key exchange not supported in server");
    } else {
        assert(s->kex_alg->main_type == KEXTYPE_RSA);
        ppl_logevent("Doing RSA key exchange with hash %s",
                     ssh_hash_alg(s->exhash)->text_name);
        s->ppl.bpp->pls->kctx = SSH2_PKTCTX_RSAKEX;

        const struct ssh_rsa_kex_extra *extra =
            (const struct ssh_rsa_kex_extra *)s->kex_alg->extra;

        if (s->ssc && s->ssc->rsa_kex_key) {
            int klen = ssh_rsakex_klen(s->ssc->rsa_kex_key);
            if (klen >= extra->minklen) {
                ppl_logevent("Using configured %d-bit RSA key", klen);
                s->rsa_kex_key = s->ssc->rsa_kex_key;
            } else {
                ppl_logevent("Configured %d-bit RSA key is too short (min %d)",
                             klen, extra->minklen);
            }
        }

        if (!s->rsa_kex_key) {
            ppl_logevent("Generating a %d-bit RSA key", extra->minklen);

            s->rsa_kex_key = snew(RSAKey);

            PrimeGenerationContext *pgc = primegen_new_context(
                &primegen_probabilistic);
            ProgressReceiver null_progress;
            null_progress.vt = &null_progress_vt;
            rsa_generate(s->rsa_kex_key, extra->minklen, false,
                         pgc, &null_progress);
            primegen_free_context(pgc);

            s->rsa_kex_key->comment = NULL;
            s->rsa_kex_key_needs_freeing = true;
        }

        pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_KEXRSA_PUBKEY);
        put_stringpl(pktout, s->hostkeydata);
        {
            strbuf *pubblob = strbuf_new();
            ssh_key_public_blob(&s->rsa_kex_key->sshk,
                                BinarySink_UPCAST(pubblob));
            put_string(s->exhash, pubblob->u, pubblob->len);
            put_stringsb(pktout, pubblob);
        }
        pq_push(s->ppl.out_pq, pktout);

        crMaybeWaitUntilV((pktin = ssh2_transport_pop(s)) != NULL);
        if (pktin->type != SSH2_MSG_KEXRSA_SECRET) {
            ssh_proto_error(s->ppl.ssh, "Received unexpected packet when "
                            "expecting RSA kex secret, type %d (%s)",
                            pktin->type,
                            ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                          s->ppl.bpp->pls->actx,
                                          pktin->type));
            *aborted = true;
            return;
        }

        mp_int *K;
        {
            ptrlen encrypted_secret = get_string(pktin);
            put_stringpl(s->exhash, encrypted_secret);
            K = ssh_rsakex_decrypt(
                s->rsa_kex_key, s->kex_alg->hash, encrypted_secret);
        }

        if (!K) {
            ssh_proto_error(s->ppl.ssh, "Unable to decrypt RSA kex secret");
            *aborted = true;
            return;
        }

        put_mp_ssh2(s->kex_shared_secret, K);
        mp_free(K);

        if (s->rsa_kex_key_needs_freeing) {
            ssh_rsakex_freekey(s->rsa_kex_key);
            sfree(s->rsa_kex_key);
        }
        s->rsa_kex_key = NULL;
        s->rsa_kex_key_needs_freeing = false;

        pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_KEXRSA_DONE);
        put_stringsb(pktout, finalise_and_sign_exhash(s));
        pq_push(s->ppl.out_pq, pktout);
    }

    crFinishV;
}